

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32.cpp
# Opt level: O1

uint32_t __thiscall
boost::deflate::detail::adler32_test::eq(adler32_test *this,char *data,int size,uint32_t init)

{
  uint32_t adler;
  uint uVar1;
  size_t sVar2;
  uLong uVar3;
  
  uVar1 = size;
  if (size < 1) {
    sVar2 = strlen(data);
    uVar1 = (uint)sVar2;
  }
  adler = init;
  if (init == 0xffffffff) {
    adler = adler32((uchar *)0x0,0,0);
  }
  uVar1 = adler32((uchar *)data,uVar1,adler);
  if (init == 0xffffffff) {
    uVar3 = ::adler32(0,(Bytef *)0x0,0);
  }
  else {
    uVar3 = (uLong)init;
  }
  if (size < 1) {
    sVar2 = strlen(data);
    size = (int)sVar2;
  }
  uVar3 = ::adler32(uVar3,(Bytef *)data,size);
  return (uint32_t)(uVar3 == uVar1);
}

Assistant:

std::uint32_t eq(const char* data, int size = -1, std::uint32_t init = -1) {
    return adler32(reinterpret_cast<const unsigned char*>(data),
                   size > 0 ? size : std::strlen(data), init != -1U ? init : adler32(nullptr, 0))
           == ::adler32(init != -1U ? init : ::adler32(0, nullptr, 0),
                        reinterpret_cast<const unsigned char*>(data),
                        size > 0 ? size : std::strlen(data));
  }